

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateFastStFldForCustomProperty(Lowerer *this,Instr *instr,LabelInstr **labelHelperRef)

{
  SymOpnd *this_00;
  Sym *pSVar1;
  Func *func;
  ScriptContextInfo *pSVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  ValueType valueType;
  BailOutKind BVar6;
  int iVar7;
  undefined4 *puVar8;
  RegOpnd *baseOpnd;
  LabelInstr *pLVar9;
  IndirOpnd *pIVar10;
  undefined4 extraout_var;
  AddrOpnd *compareSrc2;
  IntConstOpnd *src;
  undefined1 local_58 [8];
  AutoReuseOpnd autoReuseObjectOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType objectValueType;
  Lowerer *this_01;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a2b,"(instr)","instr");
    if (!bVar4) goto LAB_005cab48;
    *puVar8 = 0;
  }
  if (labelHelperRef == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a2c,"(labelHelperRef)","labelHelperRef");
    if (!bVar4) goto LAB_005cab48;
    *puVar8 = 0;
  }
  if (*labelHelperRef != (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5a2d,"(!*labelHelperRef)","!*labelHelperRef");
    if (!bVar4) goto LAB_005cab48;
    *puVar8 = 0;
  }
  if ((instr->m_opcode == StFldStrict) || (instr->m_opcode == StFld)) {
    this_00 = (SymOpnd *)instr->m_dst;
    OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_005cab48;
      *puVar8 = 0;
    }
    pSVar1 = this_00->m_sym;
    autoReuseObjectOpnd._16_8_ = this;
    if (pSVar1->m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar4) {
LAB_005cab48:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    if ((*(int *)&pSVar1[1]._vptr_Sym == 0x1a2) &&
       (bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_00), bVar4)) {
      local_32[0] = (this_00->propertyOwnerValueType).field_0;
      bVar4 = ValueType::IsLikelyRegExp((ValueType *)&local_32[0].field_0);
      if ((bVar4) &&
         (((instr->field_0x38 & 0x10) == 0 ||
          (BVar6 = IR::Instr::GetBailOutKind(instr),
          (BVar6 & ~BailOutIntOnly) == BailOutOnImplicitCalls)))) {
        func = instr->m_func;
        baseOpnd = IR::SymOpnd::CreatePropertyOwnerOpnd(this_00,func);
        local_58 = (undefined1  [8])0x0;
        IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_58,&baseOpnd->super_Opnd,func,true);
        bVar4 = IR::Opnd::IsNotTaggedValue(&baseOpnd->super_Opnd);
        if (bVar4) {
          pLVar9 = (LabelInstr *)0x0;
        }
        else {
          pLVar9 = IR::LabelInstr::New(Label,func,true);
          *labelHelperRef = pLVar9;
          LowererMD::GenerateObjectTest
                    ((LowererMD *)(autoReuseObjectOpnd._16_8_ + 8),&baseOpnd->super_Opnd,instr,
                     pLVar9,false);
        }
        bVar4 = ValueType::IsObject((ValueType *)&local_32[0].field_0);
        if (!bVar4) {
          if (pLVar9 == (LabelInstr *)0x0) {
            pLVar9 = IR::LabelInstr::New(Label,func,true);
            *labelHelperRef = pLVar9;
          }
          pIVar10 = IR::IndirOpnd::New(baseOpnd,0,TyUint64,func,false);
          pSVar2 = instr->m_func->m_scriptContextInfo;
          iVar7 = (*pSVar2->_vptr_ScriptContextInfo[0x21])(pSVar2,0x23);
          this_01 = (Lowerer *)CONCAT44(extraout_var,iVar7);
          compareSrc2 = IR::AddrOpnd::New(this_01,AddrOpndKindDynamicVtable,
                                          *(Func **)autoReuseObjectOpnd._16_8_,false,(Var)0x0);
          InsertCompareBranch(this_01,&pIVar10->super_Opnd,&compareSrc2->super_Opnd,BrNeq_A,false,
                              pLVar9,instr,false);
          valueType = ValueType::ToDefiniteObject((ValueType *)&local_32[0].field_0);
          IR::Opnd::SetValueType(&baseOpnd->super_Opnd,valueType);
        }
        pIVar10 = IR::IndirOpnd::New(baseOpnd,0x30,TyVar,func,false);
        InsertMove(&pIVar10->super_Opnd,instr->m_src1,instr,true);
        pIVar10 = IR::IndirOpnd::New(baseOpnd,0x38,TyUint32,func,false);
        src = IR::IntConstOpnd::New(0xfffffffe,TyUint32,func,true);
        InsertMove(&pIVar10->super_Opnd,&src->super_Opnd,instr,true);
        pLVar9 = IR::Instr::GetOrCreateContinueLabel(instr,false);
        InsertBranch(Br,false,pLVar9,instr);
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_58);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Lowerer::GenerateFastStFldForCustomProperty(IR::Instr *const instr, IR::LabelInstr * *const labelHelperRef)
{
    Assert(instr);
    Assert(labelHelperRef);
    Assert(!*labelHelperRef);

    switch(instr->m_opcode)
    {
        case Js::OpCode::StFld:
        case Js::OpCode::StFldStrict:
            break;

        default:
            return false;
    }

    IR::SymOpnd *const symOpnd = instr->GetDst()->AsSymOpnd();
    PropertySym *const propertySym = symOpnd->m_sym->AsPropertySym();
    if(propertySym->m_propertyId != Js::PropertyIds::lastIndex || !symOpnd->IsPropertySymOpnd())
    {
        return false;
    }

    const ValueType objectValueType(symOpnd->GetPropertyOwnerValueType());
    if(!objectValueType.IsLikelyRegExp())
    {
        return false;
    }

    if(instr->HasBailOutInfo())
    {
        const IR::BailOutKind bailOutKind = instr->GetBailOutKind();
        if(!BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind) || bailOutKind & IR::BailOutKindBits)
        {
            // Other bailout kinds will likely need bailout checks that would not be generated here. In particular, if a type
            // check is necessary here to guard against downstream property accesses on the same object, the type check will
            // fail and cause a bailout if the object is a RegExp object since the "lastIndex" property accesses are not cached.
            return false;
        }
    }

    Func *const func = instr->m_func;

    IR::RegOpnd *const objectOpnd = symOpnd->CreatePropertyOwnerOpnd(func);
    const IR::AutoReuseOpnd autoReuseObjectOpnd(objectOpnd, func);

    IR::LabelInstr *labelHelper = nullptr;
    if(!objectOpnd->IsNotTaggedValue())
    {
        //     test object, 1
        //     jnz $helper
        if(!labelHelper)
        {
            *labelHelperRef = labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        m_lowererMD.GenerateObjectTest(objectOpnd, instr, labelHelper);
    }

    if(!objectValueType.IsObject())
    {
        //     cmp [object], Js::JavascriptRegExp::vtable
        //     jne $helper
        if(!labelHelper)
        {
            *labelHelperRef = labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        InsertCompareBranch(
            IR::IndirOpnd::New(objectOpnd, 0, TyMachPtr, func),
            LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp),
            Js::OpCode::BrNeq_A,
            labelHelper,
            instr);
        objectOpnd->SetValueType(objectValueType.ToDefiniteObject());
    }

    //     mov [object + offset(lastIndexVar)], src
    //     mov [object + offset(lastIndexOrFlag)], Js::JavascriptRegExp::NotCachedValue
    //     jmp $done
    InsertMove(
        IR::IndirOpnd::New(objectOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexVar(), TyVar, func),
        instr->GetSrc1(),
        instr);
    InsertMove(
        IR::IndirOpnd::New(objectOpnd, Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag(), TyUint32, func),
        IR::IntConstOpnd::New(Js::JavascriptRegExp::NotCachedValue, TyUint32, func, true),
        instr);
    InsertBranch(Js::OpCode::Br, instr->GetOrCreateContinueLabel(), instr);

    return true;
}